

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

BOOL __thiscall
Js::VariableWalkerBase::Get(VariableWalkerBase *this,int i,ResolvedObject *pResolvedObject)

{
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  Type *ppDVar6;
  char16_t *pcVar7;
  PropertyRecord *pPVar8;
  Var aValue;
  undefined4 extraout_var_01;
  RecyclableObject *this_01;
  Type TVar9;
  uint propertyId;
  DiagStackFrame *pDVar10;
  Type TVar11;
  undefined4 extraout_var_00;
  
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x166,"(pResolvedObject)","Bad usage of VariableWalkerBase::Get");
    if (!bVar2) goto LAB_007e6a95;
    *puVar5 = 0;
  }
  pDVar10 = this->pFrame;
  if (pDVar10 == (DiagStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x168,"(pFrame)","pFrame");
    if (!bVar2) goto LAB_007e6a95;
    *puVar5 = 0;
    pDVar10 = this->pFrame;
  }
  iVar3 = (*pDVar10->_vptr_DiagStackFrame[10])();
  pResolvedObject->scriptContext = (ScriptContext *)CONCAT44(extraout_var,iVar3);
  if (i < 0) {
    BVar4 = 0;
  }
  else {
    this_00 = this->pMembersList;
    TVar9 = 0;
    if (this_00 !=
        (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)0x0) {
      TVar9 = (this_00->
              super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
              ).count;
    }
    if (TVar9 <= i) {
      return 0;
    }
    ppDVar6 = JsUtil::
              List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_00,i);
    propertyId = (*ppDVar6)->propId;
    pResolvedObject->propId = propertyId;
    if (propertyId == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x173,"(pResolvedObject->propId != Js::Constants::NoProperty)",
                                  "pResolvedObject->propId != Js::Constants::NoProperty");
      if (!bVar2) goto LAB_007e6a95;
      *puVar5 = 0;
      propertyId = pResolvedObject->propId;
    }
    if (propertyId < 0x10) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x174,"(!Js::IsInternalPropertyId(pResolvedObject->propId))",
                                  "!Js::IsInternalPropertyId(pResolvedObject->propId)");
      if (!bVar2) goto LAB_007e6a95;
      *puVar5 = 0;
      propertyId = pResolvedObject->propId;
    }
    if ((propertyId & 0xfffffffe) == 0x2d6) {
      pcVar7 = L"super";
    }
    else {
      pPVar8 = ScriptContext::GetPropertyName(pResolvedObject->scriptContext,propertyId);
      pcVar7 = (char16_t *)(pPVar8 + 1);
    }
    pResolvedObject->name = pcVar7;
    iVar3 = (*(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[6])
                      (this,(ulong)(uint)i);
    aValue = (Var)CONCAT44(extraout_var_00,iVar3);
    pResolvedObject->obj = aValue;
    if (aValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x182,"(pResolvedObject->obj)","pResolvedObject->obj");
      if (!bVar2) goto LAB_007e6a95;
      *puVar5 = 0;
      aValue = pResolvedObject->obj;
      if (aValue == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_007e6a95;
        *puVar5 = 0;
        aValue = (Var)0x0;
      }
    }
    bVar2 = TaggedInt::Is(aValue);
    if (bVar2) {
      TVar11 = TypeIds_FirstNumberType;
    }
    else if ((ulong)aValue >> 0x32 == 0) {
      this_01 = UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (this_01 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_007e6a95;
        *puVar5 = 0;
      }
      TVar11 = ((this_01->type).ptr)->typeId;
      if ((0x57 < (int)TVar11) && (BVar4 = RecyclableObject::IsExternal(this_01), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
LAB_007e6a95:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
    else {
      TVar11 = TypeIds_Number;
    }
    pResolvedObject->typeId = TVar11;
    iVar3 = (*(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[5])
                      (this,(ulong)(uint)i);
    pResolvedObject->address = (IDiagObjectAddress *)CONCAT44(extraout_var_01,iVar3);
    iVar3 = (*(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[7])
                      (this,(ulong)(uint)i);
    pResolvedObject->isConst = SUB41(iVar3,0);
    pResolvedObject->objectDisplay = (IDiagObjectModelDisplay *)0x0;
    BVar4 = 1;
  }
  return BVar4;
}

Assistant:

BOOL VariableWalkerBase::Get(int i, ResolvedObject* pResolvedObject)
    {
        AssertMsg(pResolvedObject, "Bad usage of VariableWalkerBase::Get");

        Assert(pFrame);
        pResolvedObject->scriptContext    = pFrame->GetScriptContext();

        if (i < 0)
        {
            return FALSE;
        }

        if (GetMemberCount() > i)
        {
            pResolvedObject->propId           = pMembersList->Item(i)->propId;
            Assert(pResolvedObject->propId != Js::Constants::NoProperty);
            Assert(!Js::IsInternalPropertyId(pResolvedObject->propId));

            if (pResolvedObject->propId == Js::PropertyIds::_super || pResolvedObject->propId == Js::PropertyIds::_superConstructor)
            {
                pResolvedObject->name         = _u("super");
            }
            else
            {
                const Js::PropertyRecord* propertyRecord = pResolvedObject->scriptContext->GetPropertyName(pResolvedObject->propId);
                pResolvedObject->name         = propertyRecord->GetBuffer();
            }


            pResolvedObject->obj              = GetVarObjectAt(i);
            Assert(pResolvedObject->obj);

            pResolvedObject->typeId           = JavascriptOperators::GetTypeId(pResolvedObject->obj);

            pResolvedObject->address          = GetObjectAddress(i);
            pResolvedObject->isConst          = IsConstAt(i);

            pResolvedObject->objectDisplay    = nullptr;
            return TRUE;
        }

        return FALSE;
    }